

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O1

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString groupAndNameList;
  SimpleString groupAndName;
  SimpleString local_50;
  SimpleString local_48;
  TestResult *local_40;
  UtestShell *this_00;
  
  local_40 = result;
  SimpleString::SimpleString(&local_50,"");
  this_00 = this->tests_;
  do {
    if (this_00 == (UtestShell *)0x0) {
      SimpleString::replace(&local_50,"#","");
      SimpleString::SimpleString(&local_48," ");
      bVar1 = SimpleString::endsWith(&local_50,&local_48);
      SimpleString::~SimpleString(&local_48);
      if (bVar1) {
        SimpleString::size(&local_50);
        SimpleString::subString(&local_48,(size_t)&local_50,0);
        SimpleString::operator=(&local_50,&local_48);
        SimpleString::~SimpleString(&local_48);
      }
      pcVar3 = SimpleString::asCharString(&local_50);
      (*local_40->_vptr_TestResult[0xe])(local_40,pcVar3);
      SimpleString::~SimpleString(&local_50);
      return;
    }
    bVar1 = UtestShell::shouldRun(this_00,this->groupFilters_,this->nameFilters_);
    if (bVar1) {
LAB_001ab574:
      SimpleString::SimpleString(&local_48,"");
      SimpleString::operator+=(&local_48,"#");
      UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffc8);
      SimpleString::operator+=(&local_48,(SimpleString *)&stack0xffffffffffffffc8);
      SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
      SimpleString::operator+=(&local_48,".");
      UtestShell::getName((UtestShell *)&stack0xffffffffffffffc8);
      SimpleString::operator+=(&local_48,(SimpleString *)&stack0xffffffffffffffc8);
      SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
      SimpleString::operator+=(&local_48,"#");
      bVar1 = SimpleString::contains(&local_50,&local_48);
      if (!bVar1) {
        SimpleString::operator+=(&local_50,&local_48);
        SimpleString::operator+=(&local_50," ");
      }
      SimpleString::~SimpleString(&local_48);
    }
    else {
      (*local_40->_vptr_TestResult[0xb])();
      if (bVar1) goto LAB_001ab574;
    }
    iVar2 = (*this_00->_vptr_UtestShell[3])(this_00);
    this_00 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  } while( true );
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULL; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}